

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

Expression * soul::ExpressionHelpers::create(Expression *__return_storage_ptr__,Type *t)

{
  bool bVar1;
  BoundedIntSize BVar2;
  ArraySize AVar3;
  Structure *s;
  char *__s;
  allocator<char> local_48d;
  undefined1 local_48c [4];
  string local_488;
  allocator<char> local_461;
  string local_460;
  string local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  Expression local_3e0;
  allocator<char> local_3c1;
  string local_3c0;
  Expression local_3a0;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  Expression local_328;
  allocator<char> local_309;
  string local_308;
  Expression local_2e8;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  Expression local_270;
  Type local_258;
  Expression local_240;
  allocator<char> local_221;
  string local_220;
  Expression local_200;
  Type local_1e8;
  Expression local_1d0;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  Expression local_158;
  undefined1 local_13c [28];
  Expression local_120;
  allocator<char> local_101;
  string local_100;
  Expression local_e0;
  Type local_c8;
  Expression local_b0;
  Type local_98;
  Expression local_80;
  allocator<char> local_51;
  string local_50;
  Expression local_30;
  Type *local_18;
  Type *t_local;
  
  local_18 = t;
  t_local = (Type *)__return_storage_ptr__;
  bVar1 = Type::isConst(t);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"const ",&local_51);
    createKeyword(&local_30,&local_50);
    Type::removeConst(&local_98,local_18);
    create(&local_80,&local_98);
    soul::operator+(__return_storage_ptr__,&local_30,&local_80);
    SourceCodeModel::Expression::~Expression(&local_80);
    Type::~Type(&local_98);
    SourceCodeModel::Expression::~Expression(&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  else {
    bVar1 = Type::isReference(local_18);
    if (bVar1) {
      Type::removeReference(&local_c8,local_18);
      create(&local_b0,&local_c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"&",&local_101);
      createText(&local_e0,&local_100);
      soul::operator+(__return_storage_ptr__,&local_b0,&local_e0);
      SourceCodeModel::Expression::~Expression(&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      SourceCodeModel::Expression::~Expression(&local_b0);
      Type::~Type(&local_c8);
    }
    else {
      bVar1 = Type::isVector(local_18);
      if (bVar1) {
        Type::getPrimitiveType((Type *)local_13c);
        Type::Type((Type *)(local_13c + 4),(PrimitiveType *)local_13c);
        create(&local_120,(Type *)(local_13c + 4));
        AVar3 = Type::getVectorSize(local_18);
        std::__cxx11::to_string(&local_1b8,AVar3);
        std::operator+(&local_198,"<",&local_1b8);
        std::operator+(&local_178,&local_198,">");
        createText(&local_158,&local_178);
        soul::operator+(__return_storage_ptr__,&local_120,&local_158);
        SourceCodeModel::Expression::~Expression(&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        SourceCodeModel::Expression::~Expression(&local_120);
        Type::~Type((Type *)(local_13c + 4));
      }
      else {
        bVar1 = Type::isUnsizedArray(local_18);
        if (bVar1) {
          Type::getArrayElementType(&local_1e8,local_18);
          create(&local_1d0,&local_1e8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"[]",&local_221);
          createText(&local_200,&local_220);
          soul::operator+(__return_storage_ptr__,&local_1d0,&local_200);
          SourceCodeModel::Expression::~Expression(&local_200);
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator(&local_221);
          SourceCodeModel::Expression::~Expression(&local_1d0);
          Type::~Type(&local_1e8);
        }
        else {
          bVar1 = Type::isArray(local_18);
          if (bVar1) {
            Type::getArrayElementType(&local_258,local_18);
            create(&local_240,&local_258);
            AVar3 = Type::getArraySize(local_18);
            std::__cxx11::to_string(&local_2d0,AVar3);
            std::operator+(&local_2b0,"[",&local_2d0);
            std::operator+(&local_290,&local_2b0,"]");
            createText(&local_270,&local_290);
            soul::operator+(__return_storage_ptr__,&local_240,&local_270);
            SourceCodeModel::Expression::~Expression(&local_270);
            std::__cxx11::string::~string((string *)&local_290);
            std::__cxx11::string::~string((string *)&local_2b0);
            std::__cxx11::string::~string((string *)&local_2d0);
            SourceCodeModel::Expression::~Expression(&local_240);
            Type::~Type(&local_258);
          }
          else {
            bVar1 = Type::isWrapped(local_18);
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_308,"wrap",&local_309);
              createKeyword(&local_2e8,&local_308);
              BVar2 = Type::getBoundedIntLimit(local_18);
              std::__cxx11::to_string(&local_388,BVar2);
              std::operator+(&local_368,"<",&local_388);
              std::operator+(&local_348,&local_368,">");
              createText(&local_328,&local_348);
              soul::operator+(__return_storage_ptr__,&local_2e8,&local_328);
              SourceCodeModel::Expression::~Expression(&local_328);
              std::__cxx11::string::~string((string *)&local_348);
              std::__cxx11::string::~string((string *)&local_368);
              std::__cxx11::string::~string((string *)&local_388);
              SourceCodeModel::Expression::~Expression(&local_2e8);
              std::__cxx11::string::~string((string *)&local_308);
              std::allocator<char>::~allocator(&local_309);
            }
            else {
              bVar1 = Type::isClamped(local_18);
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3c0,"clamp",&local_3c1);
                createKeyword(&local_3a0,&local_3c0);
                BVar2 = Type::getBoundedIntLimit(local_18);
                std::__cxx11::to_string(&local_440,BVar2);
                std::operator+(&local_420,"<",&local_440);
                std::operator+(&local_400,&local_420,">");
                createText(&local_3e0,&local_400);
                soul::operator+(__return_storage_ptr__,&local_3a0,&local_3e0);
                SourceCodeModel::Expression::~Expression(&local_3e0);
                std::__cxx11::string::~string((string *)&local_400);
                std::__cxx11::string::~string((string *)&local_420);
                std::__cxx11::string::~string((string *)&local_440);
                SourceCodeModel::Expression::~Expression(&local_3a0);
                std::__cxx11::string::~string((string *)&local_3c0);
                std::allocator<char>::~allocator(&local_3c1);
              }
              else {
                bVar1 = Type::isStruct(local_18);
                if (bVar1) {
                  s = Type::getStructRef(local_18);
                  createStruct(__return_storage_ptr__,s);
                }
                else {
                  bVar1 = Type::isStringLiteral(local_18);
                  if (bVar1) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_460,"string",&local_461);
                    createPrimitive(__return_storage_ptr__,&local_460);
                    std::__cxx11::string::~string((string *)&local_460);
                    std::allocator<char>::~allocator(&local_461);
                  }
                  else {
                    Type::getPrimitiveType((Type *)local_48c);
                    __s = PrimitiveType::getDescription((PrimitiveType *)local_48c);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)(local_48c + 4),__s,&local_48d);
                    createPrimitive(__return_storage_ptr__,(string *)(local_48c + 4));
                    std::__cxx11::string::~string((string *)(local_48c + 4));
                    std::allocator<char>::~allocator(&local_48d);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression create (const Type& t)
    {
        if (t.isConst())          return createKeyword ("const ") + create (t.removeConst());
        if (t.isReference())      return create (t.removeReference()) + createText ("&");
        if (t.isVector())         return create (t.getPrimitiveType()) + createText ("<" + std::to_string (t.getVectorSize()) + ">");
        if (t.isUnsizedArray())   return create (t.getArrayElementType()) + createText ("[]");
        if (t.isArray())          return create (t.getArrayElementType()) + createText ("[" + std::to_string (t.getArraySize()) + "]");
        if (t.isWrapped())        return createKeyword ("wrap") + createText ("<" + std::to_string (t.getBoundedIntLimit()) + ">");
        if (t.isClamped())        return createKeyword ("clamp") + createText ("<" + std::to_string (t.getBoundedIntLimit()) + ">");
        if (t.isStruct())         return createStruct (t.getStructRef());
        if (t.isStringLiteral())  return createPrimitive ("string");

        return createPrimitive (t.getPrimitiveType().getDescription());
    }